

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O0

int lsrkStep_TakeStepSSPs3(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  double *pdVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  double __x;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  int j_2;
  int j_1;
  int j;
  int in;
  sunrealtype rat;
  sunrealtype rn;
  sunrealtype rs;
  N_Vector *Xvecs;
  sunrealtype *cvals;
  ARKodeLSRKStepMem step_mem;
  int retval;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  double __x_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_60;
  undefined8 *local_30;
  
  *in_RDX = 0;
  *in_RSI = 0;
  iVar3 = lsrkStep_AccessStepMem
                    ((ARKodeMem)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     in_stack_ffffffffffffff90,
                     (ARKodeLSRKStepMem *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (iVar3 != 0) {
    return iVar3;
  }
  pdVar1 = (double *)local_30[0x12];
  puVar2 = (undefined8 *)local_30[0x13];
  __x = (double)*(int *)(local_30 + 3);
  if (0.0 < __x) {
    __x_00 = sqrt(__x);
  }
  else {
    __x_00 = 0.0;
  }
  dVar6 = 1.0 / (__x - __x_00);
  dVar7 = round(__x_00);
  iVar3 = (int)dVar7;
  if (*(int *)(in_RDI + 0x260) == 0) {
    iVar4 = (*(code *)*local_30)
                      (*(undefined8 *)(in_RDI + 0x380),*(undefined8 *)(in_RDI + 0x250),
                       *(undefined8 *)(in_RDI + 600),*(undefined8 *)(in_RDI + 0x10));
    local_30[4] = local_30[4] + 1;
    if (iVar4 != 0) {
      return -8;
    }
    *(undefined4 *)(in_RDI + 0x260) = 1;
  }
  N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) * dVar6,
               *(undefined8 *)(in_RDI + 0x250),*(undefined8 *)(in_RDI + 600),
               *(undefined8 *)(in_RDI + 0x248));
  if (*(int *)(in_RDI + 0x300) == 0) {
    N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) / __x,
                 *(undefined8 *)(in_RDI + 0x250),*(undefined8 *)(in_RDI + 600),
                 *(undefined8 *)(in_RDI + 0x268));
  }
  if ((*(long *)(in_RDI + 0x400) != 0) &&
     (iVar4 = (**(code **)(in_RDI + 0x400))
                        (*(double *)(in_RDI + 0x2c0) * dVar6 + *(double *)(in_RDI + 0x380),
                         *(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x10)), iVar4 != 0
     )) {
    return -0x26;
  }
  for (local_60 = 2; iVar4 = (iVar3 + -1) * (iVar3 + -2), local_60 <= iVar4 / 2;
      local_60 = local_60 + 1) {
    iVar4 = (*(code *)*local_30)
                      (((double)local_60 - 1.0) * dVar6 * *(double *)(in_RDI + 0x2c0) +
                       *(double *)(in_RDI + 0x2f0),*(undefined8 *)(in_RDI + 0x248),
                       *(undefined8 *)(in_RDI + 0x278),*(undefined8 *)(in_RDI + 0x10));
    local_30[4] = local_30[4] + 1;
    if (iVar4 < 0) {
      return -8;
    }
    if (0 < iVar4) {
      return 9;
    }
    N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) * dVar6,
                 *(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x278),
                 *(undefined8 *)(in_RDI + 0x248));
    if (*(int *)(in_RDI + 0x300) == 0) {
      N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) / __x,
                   *(undefined8 *)(in_RDI + 0x268),*(undefined8 *)(in_RDI + 0x278),
                   *(undefined8 *)(in_RDI + 0x268));
    }
    if ((*(long *)(in_RDI + 0x400) != 0) &&
       (iVar4 = (**(code **)(in_RDI + 0x400))
                          ((double)local_60 * dVar6 * *(double *)(in_RDI + 0x2c0) +
                           *(double *)(in_RDI + 0x2f0),*(undefined8 *)(in_RDI + 0x248),
                           *(undefined8 *)(in_RDI + 0x10)), iVar4 != 0)) {
      return -0x26;
    }
  }
  N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x270),
           (long)iVar4 % 2 & 0xffffffff);
  iVar4 = ((iVar3 + -1) * (iVar3 + -2)) / 2;
  while (iVar4 = iVar4 + 1, iVar4 <= (iVar3 * (iVar3 + 1)) / 2 + -1) {
    iVar5 = (*(code *)*local_30)
                      (((double)iVar4 - 1.0) * dVar6 * *(double *)(in_RDI + 0x2c0) +
                       *(double *)(in_RDI + 0x2f0),*(undefined8 *)(in_RDI + 0x248),
                       *(undefined8 *)(in_RDI + 0x278),*(undefined8 *)(in_RDI + 0x10));
    local_30[4] = local_30[4] + 1;
    if (iVar5 < 0) {
      return -8;
    }
    if (0 < iVar5) {
      return 9;
    }
    N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) * dVar6,
                 *(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x278),
                 *(undefined8 *)(in_RDI + 0x248));
    if (*(int *)(in_RDI + 0x300) == 0) {
      N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) / __x,
                   *(undefined8 *)(in_RDI + 0x268),*(undefined8 *)(in_RDI + 0x278),
                   *(undefined8 *)(in_RDI + 0x268));
    }
    if ((*(long *)(in_RDI + 0x400) != 0) &&
       (iVar5 = (**(code **)(in_RDI + 0x400))
                          ((double)iVar4 * dVar6 * *(double *)(in_RDI + 0x2c0) +
                           *(double *)(in_RDI + 0x2f0),*(undefined8 *)(in_RDI + 0x248),
                           *(undefined8 *)(in_RDI + 0x10)), iVar5 != 0)) {
      return -0x26;
    }
  }
  iVar4 = (*(code *)*local_30)
                    (dVar6 * ((__x_00 * (__x_00 + 1.0)) / 2.0 - 1.0) * *(double *)(in_RDI + 0x2c0) +
                     *(double *)(in_RDI + 0x2f0),*(undefined8 *)(in_RDI + 0x248),
                     *(undefined8 *)(in_RDI + 0x278),*(undefined8 *)(in_RDI + 0x10));
  local_30[4] = local_30[4] + 1;
  if (iVar4 < 0) {
    return -8;
  }
  if (0 < iVar4) {
    return 9;
  }
  *pdVar1 = (__x_00 - 1.0) / (__x_00 + __x_00 + -1.0);
  *puVar2 = *(undefined8 *)(in_RDI + 0x248);
  pdVar1[1] = __x_00 / (__x_00 + __x_00 + -1.0);
  puVar2[1] = *(undefined8 *)(in_RDI + 0x270);
  pdVar1[2] = ((__x_00 - 1.0) * dVar6 * *(double *)(in_RDI + 0x2c0)) / (__x_00 + __x_00 + -1.0);
  puVar2[2] = *(undefined8 *)(in_RDI + 0x278);
  iVar4 = N_VLinearCombination(3,pdVar1,puVar2,*(undefined8 *)(in_RDI + 0x248));
  if (iVar4 != 0) {
    return -0x1c;
  }
  if (*(int *)(in_RDI + 0x300) == 0) {
    N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) / __x,
                 *(undefined8 *)(in_RDI + 0x268),*(undefined8 *)(in_RDI + 0x278),
                 *(undefined8 *)(in_RDI + 0x268));
  }
  if ((*(long *)(in_RDI + 0x400) != 0) &&
     (iVar4 = (**(code **)(in_RDI + 0x400))
                        (dVar6 * ((__x_00 * (__x_00 - 1.0)) / 2.0) * *(double *)(in_RDI + 0x2c0) +
                         *(double *)(in_RDI + 0x2f0),*(undefined8 *)(in_RDI + 0x248),
                         *(undefined8 *)(in_RDI + 0x10)), iVar4 != 0)) {
    return -0x26;
  }
  iVar3 = (iVar3 * (iVar3 + 1)) / 2;
  do {
    iVar3 = iVar3 + 1;
    if (*(int *)(local_30 + 3) < iVar3) {
      if (*(int *)(in_RDI + 0x300) == 0) {
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)(in_RDI + 0x248),
                     *(undefined8 *)(in_RDI + 0x268),*(undefined8 *)(in_RDI + 0x268));
        uVar8 = N_VWrmsNorm(*(undefined8 *)(in_RDI + 0x268),*(undefined8 *)(in_RDI + 0x230));
        *in_RSI = uVar8;
      }
      return 0;
    }
    iVar4 = (*(code *)*local_30)
                      ((((double)iVar3 - __x_00) - 1.0) * dVar6 * *(double *)(in_RDI + 0x2c0) +
                       *(double *)(in_RDI + 0x2f0),*(undefined8 *)(in_RDI + 0x248),
                       *(undefined8 *)(in_RDI + 0x278),*(undefined8 *)(in_RDI + 0x10));
    local_30[4] = local_30[4] + 1;
    if (iVar4 < 0) {
      return -8;
    }
    if (0 < iVar4) {
      return 9;
    }
    N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) * dVar6,
                 *(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x278),
                 *(undefined8 *)(in_RDI + 0x248));
    if (*(int *)(in_RDI + 0x300) == 0) {
      N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) / __x,
                   *(undefined8 *)(in_RDI + 0x268),*(undefined8 *)(in_RDI + 0x278),
                   *(undefined8 *)(in_RDI + 0x268));
    }
  } while (((*(long *)(in_RDI + 0x400) == 0) || (*(int *)(local_30 + 3) <= iVar3)) ||
          (iVar4 = (**(code **)(in_RDI + 0x400))
                             (((double)iVar3 - __x_00) * dVar6 * *(double *)(in_RDI + 0x2c0) +
                              *(double *)(in_RDI + 0x2f0),*(undefined8 *)(in_RDI + 0x248),
                              *(undefined8 *)(in_RDI + 0x10)), iVar4 == 0));
  return -0x26;
}

Assistant:

int lsrkStep_TakeStepSSPs3(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  int retval;
  ARKodeLSRKStepMem step_mem;

  /* initialize algebraic solver convergence flag to success,
     temporal error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr   = ZERO;

  /* access ARKodeLSRKStepMem structure */
  retval = lsrkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  sunrealtype* cvals = step_mem->cvals;
  N_Vector* Xvecs    = step_mem->Xvecs;

  sunrealtype rs  = (sunrealtype)step_mem->req_stages;
  sunrealtype rn  = SUNRsqrt(rs);
  sunrealtype rat = ONE / (rs - rn);
  int in          = (int)SUNRround(rn);

  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 0,
             ark_mem->tcur);
  SUNLogExtraDebugVec(ARK_LOGGER, "stage", ark_mem->yn, "z_0(:) =");

  /* The method is not FSAL. Therefore, fn ​is computed at the beginning
     of the step unless ARKODE updated fn. */
  if (!ark_mem->fn_is_current)
  {
    retval = step_mem->fe(ark_mem->tn, ark_mem->yn, ark_mem->fn,
                          ark_mem->user_data);
    step_mem->nfe++;
    if (retval != ARK_SUCCESS)
    {
      SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return (ARK_RHSFUNC_FAIL);
    }
    ark_mem->fn_is_current = SUNTRUE;
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 1,
             ark_mem->tn + rat * ark_mem->h);

  N_VLinearSum(ONE, ark_mem->yn, ark_mem->h * rat, ark_mem->fn, ark_mem->ycur);
  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->yn, ark_mem->h / rs, ark_mem->fn, ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tn + ark_mem->h * rat,
                                   ark_mem->ycur, ark_mem->user_data);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed postprocess stage, retval = %i", retval);
      return ARK_POSTPROCESS_STAGE_FAIL;
    }
  }

  /* Evaluate stages j = 2,...,step_mem->req_stages */
  for (int j = 2; j <= ((in - 1) * (in - 2) / 2); j++)
  {
    retval =
      step_mem->fe(ark_mem->tcur + ((sunrealtype)j - ONE) * rat * ark_mem->h,
                   ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + j * rat * ark_mem->h);

    N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * rat, ark_mem->tempv3,
                 ark_mem->ycur);
    if (!ark_mem->fixedstep)
    {
      N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                   ark_mem->tempv1);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur + j * rat * ark_mem->h,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }
  }

  N_VScale(ONE, ark_mem->ycur, ark_mem->tempv2);

  for (int j = ((in - 1) * (in - 2) / 2 + 1); j <= (in * (in + 1) / 2 - 1); j++)
  {
    retval =
      step_mem->fe(ark_mem->tcur + ((sunrealtype)j - ONE) * rat * ark_mem->h,
                   ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + j * rat * ark_mem->h);

    N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * rat, ark_mem->tempv3,
                 ark_mem->ycur);
    if (!ark_mem->fixedstep)
    {
      N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                   ark_mem->tempv1);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur + j * rat * ark_mem->h,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }
  }

  retval = step_mem->fe(ark_mem->tcur +
                          rat * (rn * (rn + ONE) / TWO - ONE) * ark_mem->h,
                        ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
  step_mem->nfe++;

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                      "F_%i(:) =", in * (in + 1) / 2 - 1);
  SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
               "status = failed rhs eval, retval = %i", retval);

  if (retval < 0) { return ARK_RHSFUNC_FAIL; }
  if (retval > 0) { return RHSFUNC_RECVR; }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G,
             (in * (in + 1) / 2),
             ark_mem->tn + (in * (in - 1) / 2) * rat * ark_mem->h);

  cvals[0] = (rn - ONE) / (TWO * rn - ONE);
  Xvecs[0] = ark_mem->ycur;
  cvals[1] = rn / (TWO * rn - ONE);
  Xvecs[1] = ark_mem->tempv2;
  cvals[2] = (rn - ONE) * rat * ark_mem->h / (TWO * rn - ONE);
  Xvecs[2] = ark_mem->tempv3;

  retval = N_VLinearCombination(3, cvals, Xvecs, ark_mem->ycur);
  if (retval != 0)
  {
    SUNLogInfo(ARK_LOGGER, "end-stage",
               "status = failed vector op, retval = %i", retval);
    return ARK_VECTOROP_ERR;
  }

  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                 ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tcur +
                                     rat * (rn * (rn - ONE) / TWO) * ark_mem->h,
                                   ark_mem->ycur, ark_mem->user_data);
    if (retval != 0) { return ARK_POSTPROCESS_STAGE_FAIL; }
  }

  for (int j = (in * (in + 1) / 2 + 1); j <= step_mem->req_stages; j++)
  {
    retval = step_mem->fe(ark_mem->tcur +
                            ((sunrealtype)j - rn - ONE) * rat * ark_mem->h,
                          ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + ((sunrealtype)j - rn) * rat * ark_mem->h);

    N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * rat, ark_mem->tempv3,
                 ark_mem->ycur);
    if (!ark_mem->fixedstep)
    {
      N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                   ark_mem->tempv1);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL && j < step_mem->req_stages)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur +
                                       ((sunrealtype)j - rn) * rat * ark_mem->h,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }
  }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");
  SUNLogInfo(ARK_LOGGER, "begin-compute-embedding", "");

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep)
  {
    SUNLogExtraDebugVec(ARK_LOGGER, "embedded solution", ark_mem->tempv1,
                        "y_embedded(:) =");
    N_VLinearSum(ONE, ark_mem->ycur, -ONE, ark_mem->tempv1, ark_mem->tempv1);
    *dsmPtr = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);
  }

  SUNLogInfo(ARK_LOGGER, "end-compute-embedding", "status = success");

  return ARK_SUCCESS;
}